

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gestures.h
# Opt level: O0

void ProcessGestureEvent(GestureEvent event)

{
  Vector2 VVar1;
  float fVar2;
  float fVar3;
  Vector2 VVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  VVar4 = GESTURES.Touch.downPositionB;
  VVar1 = GESTURES.Touch.downPositionA;
  GESTURES.Touch.pointCount = in_stack_0000000c;
  if (in_stack_0000000c < 2) {
    if (in_stack_00000008 == 1) {
      GESTURES.Touch.tapCounter = GESTURES.Touch.tapCounter + 1;
      if ((((GESTURES.current != 0) || (GESTURES.Touch.tapCounter < 2)) ||
          (dVar7 = GetCurrentTime(), 300.0 <= dVar7 - GESTURES.Touch.eventTime)) ||
         (fVar6 = Vector2Distance(GESTURES.Touch.downPositionA,(Vector2)event.pointerId._8_8_),
         0.03 <= fVar6)) {
        GESTURES.Touch.tapCounter = 1;
        GESTURES.current = 1;
      }
      else {
        GESTURES.current = 2;
        GESTURES.Touch.tapCounter = 0;
      }
      GESTURES.Touch.upPosition.x = (float)event.pointerId[2];
      GESTURES.Touch.upPosition.y = (float)event.pointerId[3];
      GESTURES.Touch.downDragPosition.x = (float)event.pointerId[2];
      GESTURES.Touch.downDragPosition.y = (float)event.pointerId[3];
      GESTURES.Touch.downPositionA = GESTURES.Touch.upPosition;
      GESTURES.Touch.eventTime = GetCurrentTime();
      GESTURES.Touch.firstId = event.touchAction;
      GESTURES.Drag.vector.x = 0.0;
      GESTURES.Drag.vector.y = 0.0;
    }
    else if (in_stack_00000008 == 0) {
      if (GESTURES.current == 8) {
        GESTURES.Touch.upPosition.x = (float)event.pointerId[2];
        GESTURES.Touch.upPosition.y = (float)event.pointerId[3];
      }
      fVar6 = Vector2Distance(GESTURES.Touch.downPositionA,GESTURES.Touch.upPosition);
      GESTURES.Drag.distance = fVar6;
      dVar7 = GetCurrentTime();
      GESTURES.Drag.intensity = fVar6 / (float)(dVar7 - GESTURES.Swipe.timeDuration);
      GESTURES.Swipe.start = false;
      if ((GESTURES.Drag.intensity <= 0.0005) || (GESTURES.Touch.firstId != event.touchAction)) {
        GESTURES.Drag.distance = 0.0;
        GESTURES.Drag.intensity = 0.0;
        GESTURES.Drag.angle = 0.0;
        GESTURES.current = 0;
      }
      else {
        fVar6 = Vector2Angle(GESTURES.Touch.downPositionA,GESTURES.Touch.upPosition);
        GESTURES.Drag.angle = 360.0 - fVar6;
        if ((GESTURES.Drag.angle < 30.0) || (330.0 < GESTURES.Drag.angle)) {
          GESTURES.current = 0x10;
        }
        else if ((GESTURES.Drag.angle <= 30.0) || (120.0 <= GESTURES.Drag.angle)) {
          if ((GESTURES.Drag.angle <= 120.0) || (210.0 <= GESTURES.Drag.angle)) {
            if ((GESTURES.Drag.angle <= 210.0) || (300.0 <= GESTURES.Drag.angle)) {
              GESTURES.current = 0;
            }
            else {
              GESTURES.current = 0x80;
            }
          }
          else {
            GESTURES.current = 0x20;
          }
        }
        else {
          GESTURES.current = 0x40;
        }
      }
      GESTURES.Touch.downDragPosition.x = 0.0;
      GESTURES.Touch.downDragPosition.y = 0.0;
      GESTURES.Touch.pointCount = 0;
    }
    else {
      GESTURES.Touch.downPositionA = VVar1;
      GESTURES.Touch.downPositionB = VVar4;
      if (in_stack_00000008 == 2) {
        if (GESTURES.current == 8) {
          GESTURES.Touch.eventTime = GetCurrentTime();
        }
        if ((GESTURES.Swipe.start & 1U) == 0) {
          GESTURES.Swipe.timeDuration = GetCurrentTime();
          GESTURES.Swipe.start = true;
        }
        GESTURES.Touch.moveDownPositionA.x = (float)event.pointerId[2];
        GESTURES.Touch.moveDownPositionA.y = (float)event.pointerId[3];
        if (GESTURES.current == 4) {
          if ((GESTURES.Hold.resetRequired & 1U) != 0) {
            GESTURES.Touch.downPositionA.x = (float)event.pointerId[2];
            GESTURES.Touch.downPositionA.y = (float)event.pointerId[3];
          }
          GESTURES.Hold.resetRequired = false;
          fVar6 = Vector2Distance(GESTURES.Touch.downPositionA,(Vector2)event.pointerId._8_8_);
          if (0.015 <= fVar6) {
            GESTURES.Touch.eventTime = GetCurrentTime();
            GESTURES.current = 8;
          }
        }
        GESTURES.Drag.vector.y =
             GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
        GESTURES.Drag.vector.x =
             GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
      }
    }
  }
  else {
    GESTURES.Touch.downPositionB.x = event.position[0].x;
    fVar3 = GESTURES.Touch.downPositionB.x;
    GESTURES.Touch.downPositionB.y = event.position[0].y;
    fVar5 = GESTURES.Touch.downPositionB.y;
    GESTURES.Touch.downPositionA.x = event.pointerId[2];
    fVar6 = GESTURES.Touch.downPositionA.x;
    GESTURES.Touch.downPositionA.y = event.pointerId[3];
    fVar2 = GESTURES.Touch.downPositionA.y;
    if (in_stack_00000008 == 1) {
      VVar1.x = (float)event.pointerId[2];
      VVar1.y = (float)event.pointerId[3];
      GESTURES.Pinch.vector.y = GESTURES.Touch.downPositionB.y - GESTURES.Touch.downPositionA.y;
      GESTURES.Pinch.vector.x = GESTURES.Touch.downPositionB.x - GESTURES.Touch.downPositionA.x;
      GESTURES.current = 4;
      GESTURES.Touch.downPositionA = VVar1;
      GESTURES.Touch.downPositionB = event.position[0];
      GESTURES.Hold.timeDuration = GetCurrentTime();
    }
    else if (in_stack_00000008 == 2) {
      GESTURES.Touch.downPositionA = VVar1;
      GESTURES.Touch.downPositionB = VVar4;
      GESTURES.Pinch.distance =
           Vector2Distance(GESTURES.Touch.moveDownPositionA,GESTURES.Touch.moveDownPositionB);
      VVar1 = GESTURES.Touch.moveDownPositionA;
      GESTURES.Touch.downPositionA = GESTURES.Touch.moveDownPositionA;
      GESTURES.Touch.downPositionB = GESTURES.Touch.moveDownPositionB;
      GESTURES.Touch.moveDownPositionA.x = (float)event.pointerId[2];
      GESTURES.Touch.moveDownPositionA.y = (float)event.pointerId[3];
      GESTURES.Touch.moveDownPositionB = event.position[0];
      GESTURES.Pinch.vector.y = fVar5 - fVar2;
      GESTURES.Pinch.vector.x = fVar3 - fVar6;
      fVar6 = Vector2Distance(VVar1,(Vector2)event.pointerId._8_8_);
      if ((0.005 <= fVar6) ||
         (fVar6 = Vector2Distance(GESTURES.Touch.downPositionB,GESTURES.Touch.moveDownPositionB),
         0.005 <= fVar6)) {
        fVar6 = Vector2Distance(GESTURES.Touch.moveDownPositionA,GESTURES.Touch.moveDownPositionB);
        if (0.0 <= fVar6 - GESTURES.Pinch.distance) {
          GESTURES.current = 0x200;
        }
        else {
          GESTURES.current = 0x100;
        }
      }
      else {
        GESTURES.current = 4;
        GESTURES.Hold.timeDuration = GetCurrentTime();
      }
      fVar6 = Vector2Angle(GESTURES.Touch.moveDownPositionA,GESTURES.Touch.moveDownPositionB);
      GESTURES.Pinch.angle = 360.0 - fVar6;
    }
    else {
      GESTURES.Touch.downPositionA = VVar1;
      GESTURES.Touch.downPositionB = VVar4;
      if (in_stack_00000008 == 0) {
        GESTURES.Pinch.distance = 0.0;
        GESTURES.Pinch.angle = 0.0;
        GESTURES.Pinch.vector.x = 0.0;
        GESTURES.Pinch.vector.y = 0.0;
        GESTURES.Touch.pointCount = 0;
        GESTURES.current = 0;
      }
    }
  }
  return;
}

Assistant:

void ProcessGestureEvent(GestureEvent event)
{
    // Reset required variables
    GESTURES.Touch.pointCount = event.pointCount;      // Required on UpdateGestures()

    if (GESTURES.Touch.pointCount < 2)
    {
        if (event.touchAction == TOUCH_DOWN)
        {
            GESTURES.Touch.tapCounter++;    // Tap counter

            // Detect GESTURE_DOUBLE_TAP
            if ((GESTURES.current == GESTURE_NONE) && (GESTURES.Touch.tapCounter >= 2) && ((GetCurrentTime() - GESTURES.Touch.eventTime) < TAP_TIMEOUT) && (Vector2Distance(GESTURES.Touch.downPositionA, event.position[0]) < DOUBLETAP_RANGE))
            {
                GESTURES.current = GESTURE_DOUBLETAP;
                GESTURES.Touch.tapCounter = 0;
            }
            else    // Detect GESTURE_TAP
            {
                GESTURES.Touch.tapCounter = 1;
                GESTURES.current = GESTURE_TAP;
            }

            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downDragPosition = event.position[0];

            GESTURES.Touch.upPosition = GESTURES.Touch.downPositionA;
            GESTURES.Touch.eventTime = GetCurrentTime();

            GESTURES.Touch.firstId = event.pointerId[0];

            GESTURES.Drag.vector = (Vector2){ 0.0f, 0.0f };
        }
        else if (event.touchAction == TOUCH_UP)
        {
            if (GESTURES.current == GESTURE_DRAG) GESTURES.Touch.upPosition = event.position[0];

            // NOTE: GESTURES.Drag.intensity dependend on the resolution of the screen
            GESTURES.Drag.distance = Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);
            GESTURES.Drag.intensity = GESTURES.Drag.distance/(float)((GetCurrentTime() - GESTURES.Swipe.timeDuration));

            GESTURES.Swipe.start = false;

            // Detect GESTURE_SWIPE
            if ((GESTURES.Drag.intensity > FORCE_TO_SWIPE) && (GESTURES.Touch.firstId == event.pointerId[0]))
            {
                // NOTE: Angle should be inverted in Y
                GESTURES.Drag.angle = 360.0f - Vector2Angle(GESTURES.Touch.downPositionA, GESTURES.Touch.upPosition);

                if ((GESTURES.Drag.angle < 30) || (GESTURES.Drag.angle > 330)) GESTURES.current = GESTURE_SWIPE_RIGHT;        // Right
                else if ((GESTURES.Drag.angle > 30) && (GESTURES.Drag.angle < 120)) GESTURES.current = GESTURE_SWIPE_UP;      // Up
                else if ((GESTURES.Drag.angle > 120) && (GESTURES.Drag.angle < 210)) GESTURES.current = GESTURE_SWIPE_LEFT;   // Left
                else if ((GESTURES.Drag.angle > 210) && (GESTURES.Drag.angle < 300)) GESTURES.current = GESTURE_SWIPE_DOWN;   // Down
                else GESTURES.current = GESTURE_NONE;
            }
            else
            {
                GESTURES.Drag.distance = 0.0f;
                GESTURES.Drag.intensity = 0.0f;
                GESTURES.Drag.angle = 0.0f;

                GESTURES.current = GESTURE_NONE;
            }

            GESTURES.Touch.downDragPosition = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;
        }
        else if (event.touchAction == TOUCH_MOVE)
        {
            if (GESTURES.current == GESTURE_DRAG) GESTURES.Touch.eventTime = GetCurrentTime();

            if (!GESTURES.Swipe.start)
            {
                GESTURES.Swipe.timeDuration = GetCurrentTime();
                GESTURES.Swipe.start = true;
            }

            GESTURES.Touch.moveDownPositionA = event.position[0];

            if (GESTURES.current == GESTURE_HOLD)
            {
                if (GESTURES.Hold.resetRequired) GESTURES.Touch.downPositionA = event.position[0];

                GESTURES.Hold.resetRequired = false;

                // Detect GESTURE_DRAG
                if (Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_DRAG)
                {
                    GESTURES.Touch.eventTime = GetCurrentTime();
                    GESTURES.current = GESTURE_DRAG;
                }
            }

            GESTURES.Drag.vector.x = GESTURES.Touch.moveDownPositionA.x - GESTURES.Touch.downDragPosition.x;
            GESTURES.Drag.vector.y = GESTURES.Touch.moveDownPositionA.y - GESTURES.Touch.downDragPosition.y;
        }
    }
    else    // Two touch points
    {
        if (event.touchAction == TOUCH_DOWN)
        {
            GESTURES.Touch.downPositionA = event.position[0];
            GESTURES.Touch.downPositionB = event.position[1];

            //GESTURES.Pinch.distance = Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.downPositionB);

            GESTURES.Pinch.vector.x = GESTURES.Touch.downPositionB.x - GESTURES.Touch.downPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.downPositionB.y - GESTURES.Touch.downPositionA.y;

            GESTURES.current = GESTURE_HOLD;
            GESTURES.Hold.timeDuration = GetCurrentTime();
        }
        else if (event.touchAction == TOUCH_MOVE)
        {
            GESTURES.Pinch.distance = Vector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);

            GESTURES.Touch.downPositionA = GESTURES.Touch.moveDownPositionA;
            GESTURES.Touch.downPositionB = GESTURES.Touch.moveDownPositionB;

            GESTURES.Touch.moveDownPositionA = event.position[0];
            GESTURES.Touch.moveDownPositionB = event.position[1];

            GESTURES.Pinch.vector.x = GESTURES.Touch.moveDownPositionB.x - GESTURES.Touch.moveDownPositionA.x;
            GESTURES.Pinch.vector.y = GESTURES.Touch.moveDownPositionB.y - GESTURES.Touch.moveDownPositionA.y;

            if ((Vector2Distance(GESTURES.Touch.downPositionA, GESTURES.Touch.moveDownPositionA) >= MINIMUM_PINCH) || (Vector2Distance(GESTURES.Touch.downPositionB, GESTURES.Touch.moveDownPositionB) >= MINIMUM_PINCH))
            {
                if ((Vector2Distance(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB) - GESTURES.Pinch.distance) < 0) GESTURES.current = GESTURE_PINCH_IN;
                else GESTURES.current = GESTURE_PINCH_OUT;
            }
            else
            {
                GESTURES.current = GESTURE_HOLD;
                GESTURES.Hold.timeDuration = GetCurrentTime();
            }

            // NOTE: Angle should be inverted in Y
            GESTURES.Pinch.angle = 360.0f - Vector2Angle(GESTURES.Touch.moveDownPositionA, GESTURES.Touch.moveDownPositionB);
        }
        else if (event.touchAction == TOUCH_UP)
        {
            GESTURES.Pinch.distance = 0.0f;
            GESTURES.Pinch.angle = 0.0f;
            GESTURES.Pinch.vector = (Vector2){ 0.0f, 0.0f };
            GESTURES.Touch.pointCount = 0;

            GESTURES.current = GESTURE_NONE;
        }
    }
}